

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_uninit(ma_context *pContext)

{
  ma_context *pmVar1;
  ma_result in_EAX;
  ma_result extraout_EAX;
  
  if (pContext != (ma_context *)0x0) {
    (*pContext->onUninit)(pContext);
    pmVar1 = (pContext->deviceEnumLock).pContext;
    if (pmVar1 != (ma_context *)0x0) {
      (*(pmVar1->field_22).posix.pthread_mutex_destroy)(&(pContext->deviceEnumLock).field_1);
    }
    pmVar1 = (pContext->deviceInfoLock).pContext;
    if (pmVar1 != (ma_context *)0x0) {
      (*(pmVar1->field_22).posix.pthread_mutex_destroy)(&(pContext->deviceInfoLock).field_1);
    }
    ma__free_from_callbacks(pContext->pDeviceInfos,&pContext->allocationCallbacks);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

MA_API ma_result ma_context_uninit(ma_context* pContext)
{
    if (pContext == NULL) {
        return MA_INVALID_ARGS;
    }

    pContext->onUninit(pContext);

    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma__free_from_callbacks(pContext->pDeviceInfos, &pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);

    return MA_SUCCESS;
}